

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::ObjectEnd(ParsedScene *this,FileLoc loc)

{
  pointer *pppVar1;
  pointer pTVar2;
  pointer puVar3;
  pointer ppVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  char *pcVar36;
  long in_FS_OFFSET;
  char vb;
  char va;
  
  if (this->currentApiState == OptionsBlock) {
    pcVar36 = "Scene description must be inside world block; \"%s\" not allowed. Ignoring.";
LAB_0036b8d9:
    Error<char_const(&)[10]>(&loc,pcVar36,(char (*) [10])0x284a561);
    return;
  }
  if (this->currentApiState == Uninitialized) {
    pcVar36 = "pbrtInit() must be before calling \"%s()\". Ignoring.";
    goto LAB_0036b8d9;
  }
  if (this->currentInstance == (InstanceDefinitionSceneEntity *)0x0) {
    (this->super_SceneRepresentation).errorExit = true;
    Error(&loc,"ObjectEnd called outside of instance definition");
    return;
  }
  this->currentInstance = (InstanceDefinitionSceneEntity *)0x0;
  GraphicsState::operator=
            (this->graphicsState,
             (this->pushedGraphicsStates).
             super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>::
  pop_back(&this->pushedGraphicsStates);
  pTVar2 = (this->pushedTransforms).
           super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (this->pushedActiveTransformBits).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = *(undefined8 *)(pTVar2[-1].t[0].m.m[0] + 2);
  uVar6 = *(undefined8 *)pTVar2[-1].t[0].m.m[1];
  uVar7 = *(undefined8 *)(pTVar2[-1].t[0].m.m[1] + 2);
  uVar8 = *(undefined8 *)pTVar2[-1].t[0].m.m[2];
  uVar9 = *(undefined8 *)(pTVar2[-1].t[0].m.m[2] + 2);
  uVar10 = *(undefined8 *)pTVar2[-1].t[0].m.m[3];
  uVar11 = *(undefined8 *)(pTVar2[-1].t[0].m.m[3] + 2);
  uVar12 = *(undefined8 *)pTVar2[-1].t[0].mInv.m[0];
  uVar13 = *(undefined8 *)(pTVar2[-1].t[0].mInv.m[0] + 2);
  uVar14 = *(undefined8 *)pTVar2[-1].t[0].mInv.m[1];
  uVar15 = *(undefined8 *)(pTVar2[-1].t[0].mInv.m[1] + 2);
  uVar16 = *(undefined8 *)pTVar2[-1].t[0].mInv.m[2];
  uVar17 = *(undefined8 *)(pTVar2[-1].t[0].mInv.m[2] + 2);
  uVar18 = *(undefined8 *)pTVar2[-1].t[0].mInv.m[3];
  uVar19 = *(undefined8 *)(pTVar2[-1].t[0].mInv.m[3] + 2);
  uVar20 = *(undefined8 *)pTVar2[-1].t[1].m.m[0];
  uVar21 = *(undefined8 *)(pTVar2[-1].t[1].m.m[0] + 2);
  uVar22 = *(undefined8 *)pTVar2[-1].t[1].m.m[1];
  uVar23 = *(undefined8 *)(pTVar2[-1].t[1].m.m[1] + 2);
  uVar24 = *(undefined8 *)pTVar2[-1].t[1].m.m[2];
  uVar25 = *(undefined8 *)(pTVar2[-1].t[1].m.m[2] + 2);
  uVar26 = *(undefined8 *)pTVar2[-1].t[1].m.m[3];
  uVar27 = *(undefined8 *)(pTVar2[-1].t[1].m.m[3] + 2);
  uVar28 = *(undefined8 *)pTVar2[-1].t[1].mInv.m[0];
  uVar29 = *(undefined8 *)(pTVar2[-1].t[1].mInv.m[0] + 2);
  uVar30 = *(undefined8 *)pTVar2[-1].t[1].mInv.m[1];
  uVar31 = *(undefined8 *)(pTVar2[-1].t[1].mInv.m[1] + 2);
  uVar32 = *(undefined8 *)pTVar2[-1].t[1].mInv.m[2];
  uVar33 = *(undefined8 *)(pTVar2[-1].t[1].mInv.m[2] + 2);
  uVar34 = *(undefined8 *)pTVar2[-1].t[1].mInv.m[3];
  uVar35 = *(undefined8 *)(pTVar2[-1].t[1].mInv.m[3] + 2);
  *(undefined8 *)(this->curTransform).t[0].m.m[0] = *(undefined8 *)pTVar2[-1].t[0].m.m[0];
  *(undefined8 *)((this->curTransform).t[0].m.m[0] + 2) = uVar5;
  *(undefined8 *)(this->curTransform).t[0].m.m[1] = uVar6;
  *(undefined8 *)((this->curTransform).t[0].m.m[1] + 2) = uVar7;
  *(undefined8 *)(this->curTransform).t[0].m.m[2] = uVar8;
  *(undefined8 *)((this->curTransform).t[0].m.m[2] + 2) = uVar9;
  *(undefined8 *)(this->curTransform).t[0].m.m[3] = uVar10;
  *(undefined8 *)((this->curTransform).t[0].m.m[3] + 2) = uVar11;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[0] = uVar12;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[0] + 2) = uVar13;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[1] = uVar14;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[1] + 2) = uVar15;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[2] = uVar16;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[2] + 2) = uVar17;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[3] = uVar18;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[3] + 2) = uVar19;
  *(undefined8 *)(this->curTransform).t[1].m.m[0] = uVar20;
  *(undefined8 *)((this->curTransform).t[1].m.m[0] + 2) = uVar21;
  *(undefined8 *)(this->curTransform).t[1].m.m[1] = uVar22;
  *(undefined8 *)((this->curTransform).t[1].m.m[1] + 2) = uVar23;
  *(undefined8 *)(this->curTransform).t[1].m.m[2] = uVar24;
  *(undefined8 *)((this->curTransform).t[1].m.m[2] + 2) = uVar25;
  *(undefined8 *)(this->curTransform).t[1].m.m[3] = uVar26;
  *(undefined8 *)((this->curTransform).t[1].m.m[3] + 2) = uVar27;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[0] = uVar28;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[0] + 2) = uVar29;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[1] = uVar30;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[1] + 2) = uVar31;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[2] = uVar32;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[2] + 2) = uVar33;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[3] = uVar34;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[3] + 2) = uVar35;
  (this->pushedTransforms).
  super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar2 + -1;
  this->activeTransformBits = puVar3[-1];
  (this->pushedActiveTransformBits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar3 + -1;
  *(long *)(in_FS_OFFSET + -0x1c0) = *(long *)(in_FS_OFFSET + -0x1c0) + 1;
  ppVar4 = (this->pushStack).
           super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  va = ppVar4[-1].first;
  if (va == 'a') {
    (this->super_SceneRepresentation).errorExit = true;
    pcVar36 = "Mismatched nesting: open AttributeBegin from %s at ObjectEnd";
  }
  else {
    if (va != 't') {
      vb = 'o';
      if (va != 'o') {
        LogFatal<char_const(&)[23],char_const(&)[4],char_const(&)[23],char&,char_const(&)[4],char&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parsedscene.cpp"
                   ,0x195,"Check failed: %s == %s with %s = %s, %s = %s",
                   (char (*) [23])"pushStack.back().first",(char (*) [4])"\'o\'",
                   (char (*) [23])"pushStack.back().first",&va,(char (*) [4])"\'o\'",&vb);
      }
      goto LAB_0036ba10;
    }
    pcVar36 = "Mismatched nesting: open TransformBegin from %s at ObjectEnd";
    (this->super_SceneRepresentation).errorExit = true;
  }
  Error<pbrt::FileLoc&>(&loc,pcVar36,&ppVar4[-1].second);
LAB_0036ba10:
  pppVar1 = &(this->pushStack).
             super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pppVar1 = *pppVar1 + -1;
  return;
}

Assistant:

void ParsedScene::ObjectEnd(FileLoc loc) {
    VERIFY_WORLD("ObjectEnd");
    if (currentInstance == nullptr) {
        ErrorExitDeferred(&loc, "ObjectEnd called outside of instance definition");
        return;
    }
    currentInstance = nullptr;

    // NOTE: Must keep the following consistent with AttributeEnd
    *graphicsState = std::move(pushedGraphicsStates.back());
    pushedGraphicsStates.pop_back();

    curTransform = pushedTransforms.back();
    pushedTransforms.pop_back();
    activeTransformBits = pushedActiveTransformBits.back();
    pushedActiveTransformBits.pop_back();

    ++nObjectInstancesCreated;

    if (pushStack.back().first == 't')
        ErrorExitDeferred(&loc,
                          "Mismatched nesting: open TransformBegin from %s at ObjectEnd",
                          pushStack.back().second);
    else if (pushStack.back().first == 'a')
        ErrorExitDeferred(&loc,
                          "Mismatched nesting: open AttributeBegin from %s at ObjectEnd",
                          pushStack.back().second);
    else
        CHECK_EQ(pushStack.back().first, 'o');
    pushStack.pop_back();
}